

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# populators.h
# Opt level: O1

void __thiscall spdlog::populators::level_populator::~level_populator(level_populator *this)

{
  formatter *pfVar1;
  pointer pcVar2;
  
  (this->super_pattern_populator).super_populator._vptr_populator =
       (_func_int **)&PTR__pattern_populator_00159b40;
  pfVar1 = (this->super_pattern_populator).pf_._M_t.
           super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>._M_t.
           super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
           super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl;
  if (pfVar1 != (formatter *)0x0) {
    (*pfVar1->_vptr_formatter[1])();
  }
  (this->super_pattern_populator).pf_._M_t.
  super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>._M_t.
  super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
  super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl = (formatter *)0x0;
  pcVar2 = (this->super_pattern_populator).kKey._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->super_pattern_populator).kKey.field_2) {
    operator_delete(pcVar2);
  }
  operator_delete(this);
  return;
}

Assistant:

class SPDLOG_API level_populator : public pattern_populator
{
public:
    level_populator();
}